

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImGuiWindow *pIVar1;
  ImGuiViewportP *pIVar2;
  bool bVar3;
  ImGuiWindow **ppIVar4;
  ImGuiViewportP *in_RSI;
  ImGuiWindow *in_RDI;
  int n_1;
  ImGuiViewportP *old_viewport;
  ImGuiWindow *window_behind;
  int n;
  ImGuiContext *g;
  int local_7c;
  ImRect local_70;
  ImVec2 window_00;
  ImRect in_stack_ffffffffffffffa0;
  int local_44;
  ImRect local_40;
  ImRect local_30;
  ImGuiContext *local_20;
  ImGuiViewportP *local_18;
  ImGuiWindow *local_10;
  bool local_1;
  
  local_20 = GImGui;
  if ((((in_RSI->super_ImGuiViewport).Flags & 0x280U) == 0) || (in_RDI->Viewport == in_RSI)) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1a97e6);
    local_40 = ImGuiWindow::Rect((ImGuiWindow *)0x1a97fc);
    bVar3 = ImRect::Contains(&local_30,&local_40);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      bVar3 = GetWindowAlwaysWantOwnViewport(local_10);
      if (bVar3) {
        local_1 = false;
      }
      else {
        for (local_44 = 0; local_44 < (local_20->Windows).Size; local_44 = local_44 + 1) {
          ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_20->Windows,local_44);
          pIVar1 = *ppIVar4;
          if (pIVar1 == local_10) break;
          if ((((pIVar1->WasActive & 1U) != 0) && ((pIVar1->ViewportOwned & 1U) != 0)) &&
             ((pIVar1->Flags & 0x1000000U) == 0)) {
            in_stack_ffffffffffffffa0 = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1a98d0);
            local_70 = ImGuiWindow::Rect((ImGuiWindow *)0x1a98e6);
            bVar3 = ImRect::Overlaps((ImRect *)&stack0xffffffffffffffa0,&local_70);
            if (bVar3) {
              return false;
            }
          }
        }
        window_00 = in_stack_ffffffffffffffa0.Min;
        pIVar2 = local_10->Viewport;
        if ((local_10->ViewportOwned & 1U) != 0) {
          for (local_7c = 0; window_00 = in_stack_ffffffffffffffa0.Min,
              local_7c < (local_20->Windows).Size; local_7c = local_7c + 1) {
            ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_20->Windows,local_7c);
            if ((*ppIVar4)->Viewport == pIVar2) {
              ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_20->Windows,local_7c);
              SetWindowViewport(*ppIVar4,local_18);
            }
          }
        }
        SetWindowViewport(local_10,local_18);
        BringWindowToDisplayFront((ImGuiWindow *)window_00);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (!(viewport->Flags & (ImGuiViewportFlags_CanHostOtherWindows | ImGuiViewportFlags_Minimized)) || window->Viewport == viewport)
        return false;
    if (!viewport->GetRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}